

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Factory.cpp
# Opt level: O0

ElementPtr __thiscall
Rml::Factory::InstanceElement
          (Factory *this,Element *parent,String *instancer_name,String *tag,
          XMLAttributes *attributes)

{
  bool bVar1;
  ElementInstancer *_instancer;
  pointer pEVar2;
  ElementInstancer *instancer;
  XMLAttributes *attributes_local;
  String *tag_local;
  String *instancer_name_local;
  Element *parent_local;
  ElementPtr *element;
  
  _instancer = GetElementInstancer(instancer_name);
  if (_instancer != (ElementInstancer *)0x0) {
    (*_instancer->_vptr_ElementInstancer[2])(this,_instancer,parent,tag,attributes);
    bVar1 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)this);
    if (bVar1) {
      pEVar2 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->
                         ((unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)this);
      Element::SetInstancer(pEVar2,_instancer);
      pEVar2 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->
                         ((unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)this);
      Element::SetAttributes(pEVar2,attributes);
      pEVar2 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::get
                         ((unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)this);
      PluginRegistry::NotifyElementCreate(pEVar2);
      return (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)
             (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)this;
    }
    ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr
              ((unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)this);
  }
  ::std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>::
  unique_ptr<Rml::Releaser<Rml::Element>,void>
            ((unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>> *)this,(nullptr_t)0x0);
  return (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)
         (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)this;
}

Assistant:

ElementPtr Factory::InstanceElement(Element* parent, const String& instancer_name, const String& tag, const XMLAttributes& attributes)
{
	if (ElementInstancer* instancer = GetElementInstancer(instancer_name))
	{
		if (ElementPtr element = instancer->InstanceElement(parent, tag, attributes))
		{
			element->SetInstancer(instancer);
			element->SetAttributes(attributes);

			PluginRegistry::NotifyElementCreate(element.get());
			return element;
		}
	}

	return nullptr;
}